

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenX_ModSystem.cpp
# Opt level: O3

void __thiscall
ModListIRCCommand::trigger
          (ModListIRCCommand *this,IRC_Bot *source,string_view channel,string_view nick,
          string_view parameters)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  bool bVar2;
  long lVar3;
  long *plVar4;
  const_iterator cVar5;
  undefined8 uVar6;
  _List_node_base *p_Var7;
  undefined8 *puVar8;
  basic_string_view<char,_std::char_traits<char>_> rhs;
  basic_string_view<char,_std::char_traits<char>_> lhs;
  string msg;
  string local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b0;
  size_type local_a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_a0;
  ulong local_90;
  IRC_Bot *local_88;
  size_t local_80;
  char *local_78;
  _List_node_base *local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  size_type local_48;
  basic_string_view<char,_std::char_traits<char>_> local_40;
  
  local_78 = channel._M_str;
  local_80 = channel._M_len;
  local_68._M_dataplus._M_p = (pointer)&local_68.field_2;
  local_68._M_string_length = 0;
  local_68.field_2._M_local_buf[0] = '\0';
  local_88 = source;
  if (pluginInstance.groups.
      super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
      ._M_impl._M_node.super__List_node_base._M_next == (_List_node_base *)&pluginInstance.groups) {
LAB_001104c3:
    Jupiter::IRC::Client::sendMessage
              (local_88,local_80,local_78,0x23,"There are no configured moderators.");
  }
  else {
    paVar1 = &local_d0.field_2;
    local_90 = 0;
    local_70 = (_List_node_base *)&pluginInstance.groups;
    p_Var7 = pluginInstance.groups.
             super__List_base<RenX_ModSystemPlugin::ModGroup,_std::allocator<RenX_ModSystemPlugin::ModGroup>_>
             ._M_impl._M_node.super__List_node_base._M_next;
    do {
      while( true ) {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_assign
                  (&local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(p_Var7 + 2)
                  );
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_68,(char *)p_Var7[6]._M_next,(size_type)p_Var7[6]._M_prev);
        string_printf_abi_cxx11_(&local_d0,"\x0f (Access: %d): ",(ulong)*(uint *)&p_Var7[1]._M_prev)
        ;
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_68,local_d0._M_dataplus._M_p,local_d0._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_d0._M_dataplus._M_p != paVar1) {
          operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
        }
        local_48 = local_68._M_string_length;
        Jupiter::Plugin::getConfig();
        lVar3 = Jupiter::Config::getSections_abi_cxx11_();
        for (puVar8 = *(undefined8 **)(lVar3 + 0x10); puVar8 != (undefined8 *)0x0;
            puVar8 = (undefined8 *)*puVar8) {
          lhs = (basic_string_view<char,_std::char_traits<char>_>)
                Jupiter::Config::get(puVar8 + 5,5,"Group",0,0);
          rhs._M_str = (char *)p_Var7[6]._M_next;
          rhs._M_len = (size_t)p_Var7[6]._M_prev;
          bVar2 = jessilib::equalsi<char,char>(lhs,rhs);
          if (bVar2) {
            plVar4 = (long *)Jupiter::Config::getName_abi_cxx11_();
            local_b0 = &local_a0;
            std::__cxx11::string::_M_construct<char*>
                      ((string *)&local_b0,*plVar4,plVar4[1] + *plVar4);
            local_40._M_len = 4;
            local_40._M_str = "Name";
            cVar5 = std::
                    _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                    ::_M_find_tr<std::basic_string_view<char,std::char_traits<char>>,void,void>
                              ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,std::__detail::_Select1st,jessilib::text_equali,jessilib::text_hashi,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<false,false,true>>
                                *)(puVar8 + 10),&local_40);
            if (cVar5.
                super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                ._M_cur == (__node_type *)0x0) {
              if (local_b0 == &local_a0) {
                local_d0.field_2._8_8_ = local_a0._8_8_;
                local_b0 = paVar1;
              }
              local_d0.field_2._M_allocated_capacity._1_7_ = local_a0._M_allocated_capacity._1_7_;
              local_d0.field_2._M_local_buf[0] = local_a0._M_local_buf[0];
              local_d0._M_string_length = local_a8;
              local_a8 = 0;
              local_a0._M_local_buf[0] = '\0';
              local_d0._M_dataplus._M_p = (pointer)local_b0;
              local_b0 = &local_a0;
            }
            else {
              local_d0._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)&local_d0,
                         *(long *)((long)cVar5.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x28),
                         *(long *)((long)cVar5.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x30) +
                         *(long *)((long)cVar5.
                                         super__Node_iterator_base<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_false>
                                         ._M_cur + 0x28));
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
            _M_append(&local_68,local_d0._M_dataplus._M_p,local_d0._M_string_length);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_d0._M_dataplus._M_p != paVar1) {
              operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
            }
            if (local_b0 != &local_a0) {
              operator_delete(local_b0,CONCAT71(local_a0._M_allocated_capacity._1_7_,
                                                local_a0._M_local_buf[0]) + 1);
            }
            std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                      (&local_68,", ",2);
          }
        }
        if (local_68._M_string_length != local_48) break;
        p_Var7 = p_Var7->_M_next;
        if (p_Var7 == local_70) {
          if ((local_90 & 1) == 0) goto LAB_001104c3;
          goto LAB_001104e3;
        }
      }
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_68);
      std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::pop_back
                (&local_68);
      uVar6 = Jupiter::IRC::Client::sendMessage
                        (local_88,local_80,local_78,local_68._M_string_length,
                         local_68._M_dataplus._M_p);
      p_Var7 = p_Var7->_M_next;
      local_90 = CONCAT71((int7)((ulong)uVar6 >> 8),1);
    } while (p_Var7 != local_70);
  }
LAB_001104e3:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,
                    CONCAT71(local_68.field_2._M_allocated_capacity._1_7_,
                             local_68.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void ModListIRCCommand::trigger(IRC_Bot *source, std::string_view channel, std::string_view nick, std::string_view parameters) {
	std::string msg;
	size_t msgBaseSize;
	bool haveMods = false;
	for (auto node = pluginInstance.groups.begin(); node != pluginInstance.groups.end(); ++node) {
		msg = node->prefix;
		msg += node->name;
		msg += string_printf(IRCNORMAL " (Access: %d): ", node->access);
		msgBaseSize = msg.size();

		for (auto& section : pluginInstance.getConfig().getSections()) {
			if (jessilib::equalsi(section.second.get("Group"sv), node->name)) {
				msg += section.second.get("Name"sv, section.second.getName());
				msg += ", "sv;
			}
		}

		if (msg.size() != msgBaseSize) {
			msg.pop_back(); // ' '
			msg.pop_back(); // ','
			source->sendMessage(channel, msg);
			haveMods = true;
		}
	}
	if (!haveMods)
		source->sendMessage(channel, "There are no configured moderators."sv);
}